

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::Update
          (ChLinkMotorRotationDriveline *this,double mytime,bool update_assets)

{
  ChVector<double> shaftdir_b1;
  ChVector<double> shaftdir_b2;
  ChVector<double> abs_shaftdir;
  ChVector<double> local_d8;
  ChQuaternion<double> local_c0;
  ChVector<double> local_98;
  ChVector<double> local_78;
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8
              ))(&local_d8,this);
  ChQuaternion<double>::Rotate(&local_c0,(ChVector<double> *)&VECT_Z);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_d8,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1,&local_38);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_58,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2,&local_38);
  local_78.m_data[0] = local_d8.m_data[0];
  local_78.m_data[1] = local_d8.m_data[1];
  local_78.m_data[2] = local_d8.m_data[2];
  ChShaftsBody::SetShaftDirection
            ((this->innerconstraint1).
             super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_78);
  local_98.m_data[0] = local_58.m_data[0];
  local_98.m_data[1] = local_58.m_data[1];
  local_98.m_data[2] = local_58.m_data[2];
  ChShaftsBody::SetShaftDirection
            ((this->innerconstraint2).
             super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_98);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_Z);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);

    innerconstraint1->SetShaftDirection(shaftdir_b1);
    innerconstraint2->SetShaftDirection(shaftdir_b2);
}